

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

void __thiscall ncnn::Crop::Crop(Crop *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Crop_001ded78;
  Mat::Mat((Mat *)(in_RDI + 0x1c));
  Mat::Mat((Mat *)(in_RDI + 0x24));
  Mat::Mat((Mat *)(in_RDI + 0x2c));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Crop::Crop()
{
    one_blob_only = true;
    support_inplace = false;
}